

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_property(nk_context *ctx,char *name,nk_property_variant *variant,float inc_per_pixel,
                nk_property_filter filter)

{
  nk_hash seed;
  char *key;
  int iVar1;
  char *in_RSI;
  long in_RDI;
  int *in_stack_00000030;
  char *in_stack_00000038;
  float in_stack_00000044;
  nk_property_variant *in_stack_00000048;
  char *in_stack_00000050;
  nk_command_buffer *in_stack_00000058;
  nk_flags *in_stack_00000060;
  undefined1 in_stack_00000068 [16];
  int *in_stack_00000080;
  int *in_stack_00000088;
  int dummy_select_end;
  int dummy_select_begin;
  int dummy_cursor;
  int dummy_length;
  int dummy_state;
  char dummy_buffer [64];
  int old_state;
  int *select_end;
  int *select_begin;
  int *cursor;
  int *len;
  char *buffer;
  nk_hash hash;
  int *state;
  nk_widget_layout_states s;
  nk_rect bounds;
  nk_style *style;
  nk_input *in;
  nk_panel *layout;
  nk_window *win;
  nk_context *in_stack_fffffffffffffe90;
  nk_rect *in_stack_fffffffffffffe98;
  long local_138;
  undefined4 local_11c;
  undefined4 local_118;
  undefined4 local_114;
  int local_110 [2];
  undefined1 local_108 [68];
  int local_c4;
  undefined4 *local_c0;
  undefined4 *local_b8;
  undefined4 *local_b0;
  int *local_a8;
  undefined1 *local_a0;
  nk_hash local_94;
  int *local_90;
  nk_widget_layout_states local_84;
  long local_70;
  long local_68;
  long local_60;
  long local_58;
  char *local_40;
  long local_38;
  
  local_90 = (int *)0x0;
  local_94 = 0;
  local_a0 = (undefined1 *)0x0;
  local_a8 = (int *)0x0;
  local_b0 = (undefined4 *)0x0;
  local_b8 = (undefined4 *)0x0;
  local_c0 = (undefined4 *)0x0;
  local_110[1] = 0;
  local_110[0] = 0;
  local_114 = 0;
  local_118 = 0;
  local_11c = 0;
  if (((in_RDI != 0) && (*(long *)(in_RDI + 0x40d8) != 0)) &&
     (*(long *)(*(long *)(in_RDI + 0x40d8) + 0xa8) != 0)) {
    local_58 = *(long *)(in_RDI + 0x40d8);
    local_60 = *(long *)(local_58 + 0xa8);
    local_70 = in_RDI + 0x168;
    local_40 = in_RSI;
    local_38 = in_RDI;
    local_84 = nk_widget(in_stack_fffffffffffffe98,in_stack_fffffffffffffe90);
    key = local_40;
    if (local_84 != NK_WIDGET_INVALID) {
      if (*local_40 == '#') {
        iVar1 = nk_strlen(local_40);
        seed = *(nk_hash *)(local_58 + 0x110);
        *(nk_hash *)(local_58 + 0x110) = seed + 1;
        local_94 = nk_murmur_hash(key,iVar1,seed);
        local_40 = local_40 + 1;
      }
      else {
        iVar1 = nk_strlen(local_40);
        local_94 = nk_murmur_hash(key,iVar1,0x2a);
      }
      if ((*(int *)(local_58 + 0xb4) == 0) || (local_94 != *(nk_hash *)(local_58 + 0x10c))) {
        local_a0 = local_108;
        local_a8 = local_110;
        local_b0 = &local_114;
        local_90 = local_110 + 1;
        local_b8 = &local_118;
        local_c0 = &local_11c;
      }
      else {
        local_a0 = (undefined1 *)(local_58 + 0xbc);
        local_a8 = (int *)(local_58 + 0xfc);
        local_b0 = (undefined4 *)(local_58 + 0x100);
        local_90 = (int *)(local_58 + 0x118);
        local_b8 = (undefined4 *)(local_58 + 0x104);
        local_c0 = (undefined4 *)(local_58 + 0x108);
      }
      local_c4 = *local_90;
      *(undefined8 *)(local_38 + 0x2b28) = *(undefined8 *)(local_38 + 0x1f58);
      *(undefined8 *)(local_38 + 0x2b30) = *(undefined8 *)(local_38 + 0x1f60);
      *(undefined8 *)(local_38 + 0x2b38) = *(undefined8 *)(local_38 + 0x1f68);
      if (((local_84 == NK_WIDGET_ROM) && (*(int *)(local_58 + 0xb4) == 0)) ||
         ((*(uint *)(local_60 + 4) & 0x1000) != 0)) {
        local_138 = 0;
      }
      else {
        local_138 = local_38;
      }
      local_68 = local_138;
      nk_do_property(in_stack_00000060,in_stack_00000058,(nk_rect)in_stack_00000068,
                     in_stack_00000050,in_stack_00000048,in_stack_00000044,in_stack_00000038,
                     in_stack_00000030,in_stack_00000080,in_stack_00000088,_dummy_select_begin,
                     _dummy_length,(nk_style_property *)dummy_buffer._0_8_,dummy_buffer._8_4_,
                     (nk_input *)dummy_buffer._16_8_,(nk_user_font *)dummy_buffer._24_8_,
                     (nk_text_edit *)dummy_buffer._32_8_,dummy_buffer._40_4_);
      if (((local_68 != 0) && (*local_90 != 0)) && (*(int *)(local_58 + 0xb4) == 0)) {
        *(undefined4 *)(local_58 + 0xb4) = 1;
        nk_memcopy((void *)(local_58 + 0xbc),local_a0,(long)*local_a8);
        *(int *)(local_58 + 0xfc) = *local_a8;
        *(undefined4 *)(local_58 + 0x100) = *local_b0;
        *(int *)(local_58 + 0x118) = *local_90;
        *(nk_hash *)(local_58 + 0x10c) = local_94;
        *(undefined4 *)(local_58 + 0x104) = *local_b8;
        *(undefined4 *)(local_58 + 0x108) = *local_c0;
        if (*local_90 == 2) {
          *(undefined1 *)(local_38 + 0x164) = 1;
          *(undefined1 *)(local_38 + 0x165) = 1;
        }
      }
      if ((*local_90 == 0) && (local_c4 != 0)) {
        if (local_c4 == 2) {
          *(undefined1 *)(local_38 + 0x164) = 0;
          *(undefined1 *)(local_38 + 0x165) = 0;
          *(undefined1 *)(local_38 + 0x166) = 1;
        }
        *(undefined4 *)(local_58 + 0x104) = 0;
        *(undefined4 *)(local_58 + 0x108) = 0;
        *(undefined4 *)(local_58 + 0xb4) = 0;
      }
    }
  }
  return;
}

Assistant:

NK_LIB void
nk_property(struct nk_context *ctx, const char *name, struct nk_property_variant *variant,
float inc_per_pixel, const enum nk_property_filter filter)
{
struct nk_window *win;
struct nk_panel *layout;
struct nk_input *in;
const struct nk_style *style;

struct nk_rect bounds;
enum nk_widget_layout_states s;

int *state = 0;
nk_hash hash = 0;
char *buffer = 0;
int *len = 0;
int *cursor = 0;
int *select_begin = 0;
int *select_end = 0;
int old_state;

char dummy_buffer[NK_MAX_NUMBER_BUFFER];
int dummy_state = NK_PROPERTY_DEFAULT;
int dummy_length = 0;
int dummy_cursor = 0;
int dummy_select_begin = 0;
int dummy_select_end = 0;

NK_ASSERT(ctx);
NK_ASSERT(ctx->current);
NK_ASSERT(ctx->current->layout);
if (!ctx || !ctx->current || !ctx->current->layout)
return;

win = ctx->current;
layout = win->layout;
style = &ctx->style;
s = nk_widget(&bounds, ctx);
if (!s) return;

/* calculate hash from name */
if (name[0] == '#') {
hash = nk_murmur_hash(name, (int)nk_strlen(name), win->property.seq++);
name++; /* special number hash */
} else hash = nk_murmur_hash(name, (int)nk_strlen(name), 42);

/* check if property is currently hot item */
if (win->property.active && hash == win->property.name) {
buffer = win->property.buffer;
len = &win->property.length;
cursor = &win->property.cursor;
state = &win->property.state;
select_begin = &win->property.select_start;
select_end = &win->property.select_end;
} else {
buffer = dummy_buffer;
len = &dummy_length;
cursor = &dummy_cursor;
state = &dummy_state;
select_begin =  &dummy_select_begin;
select_end = &dummy_select_end;
}

/* execute property widget */
old_state = *state;
ctx->text_edit.clip = ctx->clip;
in = ((s == NK_WIDGET_ROM && !win->property.active) ||
layout->flags & NK_WINDOW_ROM) ? 0 : &ctx->input;
nk_do_property(&ctx->last_widget_state, &win->buffer, bounds, name,
variant, inc_per_pixel, buffer, len, state, cursor, select_begin,
select_end, &style->property, filter, in, style->font, &ctx->text_edit,
ctx->button_behavior);

if (in && *state != NK_PROPERTY_DEFAULT && !win->property.active) {
/* current property is now hot */
win->property.active = 1;
NK_MEMCPY(win->property.buffer, buffer, (nk_size)*len);
win->property.length = *len;
win->property.cursor = *cursor;
win->property.state = *state;
win->property.name = hash;
win->property.select_start = *select_begin;
win->property.select_end = *select_end;
if (*state == NK_PROPERTY_DRAG) {
ctx->input.mouse.grab = nk_true;
ctx->input.mouse.grabbed = nk_true;
}
}
/* check if previously active property is now inactive */
if (*state == NK_PROPERTY_DEFAULT && old_state != NK_PROPERTY_DEFAULT) {
if (old_state == NK_PROPERTY_DRAG) {
ctx->input.mouse.grab = nk_false;
ctx->input.mouse.grabbed = nk_false;
ctx->input.mouse.ungrab = nk_true;
}
win->property.select_start = 0;
win->property.select_end = 0;
win->property.active = 0;
}
}